

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Pkcs7.cpp
# Opt level: O0

bool __thiscall axl::cry::Pkcs7::loadPem(Pkcs7 *this,void *p,size_t size)

{
  BIO *bp;
  PKCS7 *pPVar1;
  int in_ESI;
  Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> *in_RDI;
  PKCS7 *result;
  PKCS7 *pkcs7;
  Bio bio;
  pkcs7_st *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  void *in_stack_ffffffffffffff88;
  Bio *in_stack_ffffffffffffff90;
  PKCS7 *local_40 [3];
  Handle local_28 [39];
  bool local_1;
  
  sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::close(in_RDI,in_ESI);
  Bio::Bio((Bio *)0x151984);
  Bio::createMemBuf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  local_40[0] = PKCS7_new();
  bp = (BIO *)sl::Handle::operator_cast_to_bio_st_(local_28);
  pPVar1 = PEM_read_bio_PKCS7(bp,local_40,(undefined1 *)0x0,(void *)0x0);
  if (pPVar1 == (PKCS7 *)0x0) {
    local_1 = failWithLastCryptoError();
  }
  else {
    sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::attach
              ((Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_1 = true;
  }
  Bio::~Bio((Bio *)0x151a57);
  return (bool)(local_1 & 1);
}

Assistant:

bool
Pkcs7::loadPem(
	const void* p,
	size_t size
) {
	close();

	Bio bio;
	bio.createMemBuf(p, size);

	PKCS7* pkcs7 = PKCS7_new();
	PKCS7* result = PEM_read_bio_PKCS7(bio, &pkcs7, NULL, NULL);
	if (!result) {
		ASSERT(pkcs7 == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(pkcs7);
	return true;
}